

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void jsonParseReset(JsonParse *pParse)

{
  ulong uVar1;
  long *p;
  
  if (pParse->bJsonIsRCStr != '\0') {
    uVar1 = *(ulong *)(pParse->zJson + -8);
    p = (long *)(pParse->zJson + -8);
    if (uVar1 < 2) {
      sqlite3_free(p);
    }
    else {
      *p = uVar1 - 1;
    }
    pParse->zJson = (char *)0x0;
    pParse->nJson = 0;
    pParse->bJsonIsRCStr = '\0';
  }
  if (pParse->nBlobAlloc != 0) {
    if (pParse->aBlob != (u8 *)0x0) {
      sqlite3DbFreeNN(pParse->db,pParse->aBlob);
    }
    pParse->aBlob = (u8 *)0x0;
    pParse->nBlob = 0;
    pParse->nBlobAlloc = 0;
  }
  return;
}

Assistant:

static void jsonParseReset(JsonParse *pParse){
  assert( pParse->nJPRef<=1 );
  if( pParse->bJsonIsRCStr ){
    sqlite3RCStrUnref(pParse->zJson);
    pParse->zJson = 0;
    pParse->nJson = 0;
    pParse->bJsonIsRCStr = 0;
  }
  if( pParse->nBlobAlloc ){
    sqlite3DbFree(pParse->db, pParse->aBlob);
    pParse->aBlob = 0;
    pParse->nBlob = 0;
    pParse->nBlobAlloc = 0;
  }
}